

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpTest::ReadModule(InterpTest *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  bool bVar1;
  uchar *data_00;
  size_type size;
  Message *message;
  char *message_00;
  AssertHelper local_d0;
  string local_c8;
  Color local_a8;
  string local_98;
  Message local_78;
  Enum local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [4];
  Result result;
  ReadBinaryOptions options;
  Errors errors;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  InterpTest *this_local;
  
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&options.read_debug_names);
  wabt::ReadBinaryOptions::ReadBinaryOptions((ReadBinaryOptions *)local_50);
  data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(data);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  gtest_ar.message_.ptr_._4_4_ =
       wabt::interp::ReadBinaryInterp
                 (data_00,size,(ReadBinaryOptions *)local_50,(Errors *)&options.read_debug_names,
                  &this->module_desc_);
  local_6c = Ok;
  testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
            ((EqHelper<false> *)local_68,"Result::Ok","result",&local_6c,
             (Result *)((long)&gtest_ar.message_.ptr_ + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    wabt::Color::Color(&local_a8,(FILE *)0x0,false);
    std::__cxx11::string::string((string *)&local_c8);
    wabt::FormatErrorsToString
              (&local_98,(Errors *)&options.read_debug_names,Binary,(LexerSourceLineFinder *)0x0,
               &local_a8,&local_c8,Never,0x50);
    message = testing::Message::operator<<(&local_78,&local_98);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x23,message_00);
    testing::internal::AssertHelper::operator=(&local_d0,message);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&options.read_debug_names);
  return;
}

Assistant:

void ReadModule(const std::vector<u8>& data) {
    Errors errors;
    ReadBinaryOptions options;
    Result result = ReadBinaryInterp(data.data(), data.size(), options, &errors,
                                     &module_desc_);
    ASSERT_EQ(Result::Ok, result)
        << FormatErrorsToString(errors, Location::Type::Binary);
  }